

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  MatrixOp op;
  TestContext *pTVar1;
  int iVar2;
  int vecSize;
  DataType DVar3;
  TestNode *node;
  TestNode *pTVar4;
  char *__s;
  long *plVar5;
  ShaderMatrixCase *pSVar6;
  ulong uVar7;
  long lVar8;
  InputType IVar9;
  long lVar10;
  size_type *psVar11;
  long lVar12;
  InputTypeSpec *pIVar13;
  bool bVar14;
  string local_1a0;
  string local_180;
  string vecMatName;
  ShaderInput scalarIn;
  undefined4 uStack_12c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  byte local_115;
  Precision local_114;
  TestNode *local_110;
  TestNode *local_108;
  char local_fb;
  char local_fa;
  char local_f9;
  ShaderInput matIn;
  string baseName;
  ShaderInput otherMatIn;
  long local_b8 [2];
  InputType local_a8;
  DataType local_a4;
  int local_a0;
  allocator<char> local_99;
  ShaderInput colVecIn;
  ShaderInput rowVecIn;
  
  lVar8 = 0;
  local_110 = (TestNode *)this;
  do {
    pTVar4 = local_110;
    pIVar13 = init::reducedInputTypes;
    local_fb = init::ops[lVar8].extendedInputTypeCases;
    if ((bool)local_fb != false) {
      pIVar13 = init::extendedInputTypes;
    }
    op = init::ops[lVar8].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,pTVar4->m_testCtx,init::ops[lVar8].name,init::ops[lVar8].desc);
    tcu::TestNode::addChild(pTVar4,node);
    local_fa = init::ops[lVar8].createInputTypeGroup;
    uVar7 = 0;
    do {
      local_a8 = pIVar13[uVar7].type;
      local_108 = node;
      if (local_fa != '\0') {
        pTVar4 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar4,local_110->m_testCtx,pIVar13[uVar7].name,
                   pIVar13[uVar7].desc);
        local_108 = pTVar4;
        tcu::TestNode::addChild(node,pTVar4);
      }
      IVar9 = local_a8;
      if (local_a8 == INPUTTYPE_DYNAMIC) {
        IVar9 = INPUTTYPE_UNIFORM;
      }
      lVar12 = 0;
      do {
        local_115 = op == OP_MULTIPLY_INTO;
        DVar3 = init::matrixTypes[lVar12];
        iVar2 = glu::getDataTypeMatrixNumColumns(DVar3);
        vecSize = glu::getDataTypeMatrixNumRows(DVar3);
        local_a4 = DVar3;
        glu::getDataTypeName(DVar3);
        local_f9 = op - OP_INVERSE < 2 && iVar2 == vecSize;
        local_115 = local_115 & iVar2 == vecSize;
        lVar10 = 0;
        local_a0 = iVar2;
        do {
          local_114 = init::precisions[lVar10];
          __s = glu::getPrecisionName(local_114);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,__s,(allocator<char> *)&scalarIn);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1a0.field_2._M_allocated_capacity = *psVar11;
            local_1a0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_1a0.field_2._M_allocated_capacity = *psVar11;
            local_1a0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1a0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar11) {
            vecMatName.field_2._M_allocated_capacity = *psVar11;
            vecMatName.field_2._8_8_ = plVar5[3];
          }
          else {
            vecMatName.field_2._M_allocated_capacity = *psVar11;
            vecMatName._M_dataplus._M_p = (pointer)*plVar5;
          }
          vecMatName._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&vecMatName);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar11) {
            baseName.field_2._M_allocated_capacity = *psVar11;
            baseName.field_2._8_8_ = plVar5[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar11;
            baseName._M_dataplus._M_p = (pointer)*plVar5;
          }
          baseName._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
            operator_delete(vecMatName._M_dataplus._M_p,vecMatName.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          matIn.inputType = local_a8;
          matIn.dataType = local_a4;
          matIn.precision = local_114;
          if (op < OP_COMP_MUL) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = (op != OP_DIV) + INPUTTYPE_UNIFORM;
            stack0xfffffffffffffed0 = CONCAT44(uStack_12c,local_114);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Matrix-scalar case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,&local_180,&matIn,&scalarIn,op,true);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Matrix-scalar case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,&local_180,&matIn,&scalarIn,op,false);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (op == OP_MUL) {
            DVar3 = glu::getDataTypeFloatVec(local_a0);
            colVecIn.inputType = INPUTTYPE_DYNAMIC;
            colVecIn.precision = local_114;
            colVecIn.dataType = DVar3;
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            glu::getDataTypeName(DVar3);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            scalarIn._0_8_ = &local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalarIn,"Matrix-vector case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,(string *)&scalarIn,&matIn,&colVecIn,OP_MUL,true);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            glu::getDataTypeName(DVar3);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            scalarIn._0_8_ = &local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalarIn,"Matrix-vector case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,(string *)&scalarIn,&matIn,&colVecIn,OP_MUL,false);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            DVar3 = glu::getDataTypeFloatVec(vecSize);
            rowVecIn.inputType = INPUTTYPE_DYNAMIC;
            rowVecIn.precision = local_114;
            rowVecIn.dataType = DVar3;
            std::__cxx11::string::string<std::allocator<char>>((string *)&otherMatIn,__s,&local_99);
            plVar5 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
            scalarIn._0_8_ = &local_128;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar11) {
              local_128._M_allocated_capacity = *psVar11;
              local_128._8_8_ = plVar5[3];
            }
            else {
              local_128._M_allocated_capacity = *psVar11;
              scalarIn._0_8_ = (size_type *)*plVar5;
            }
            unique0x00012000 = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            glu::getDataTypeName(DVar3);
            plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_180.field_2._M_allocated_capacity = *psVar11;
              local_180.field_2._8_8_ = plVar5[3];
            }
            else {
              local_180.field_2._M_allocated_capacity = *psVar11;
              local_180._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_180._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a0);
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar11) {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName.field_2._8_8_ = plVar5[3];
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName._M_dataplus._M_p = (pointer)*plVar5;
            }
            vecMatName._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(otherMatIn.dataType,otherMatIn.inputType) != local_b8) {
              operator_delete((long *)CONCAT44(otherMatIn.dataType,otherMatIn.inputType),
                              local_b8[0] + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,vecMatName._M_dataplus._M_p,
                       vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,local_180._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            scalarIn._0_8_ = &local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalarIn,"Vector-matrix case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&local_1a0,(string *)&scalarIn,&rowVecIn,&matIn,OP_MUL,true);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,vecMatName._M_dataplus._M_p,
                       vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,local_180._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            scalarIn._0_8_ = &local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalarIn,"Vector-matrix case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&local_1a0,(string *)&scalarIn,&rowVecIn,&matIn,OP_MUL,false);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            iVar2 = 2;
            do {
              DVar3 = glu::getDataTypeMatrix(iVar2,local_a0);
              otherMatIn.precision = local_114;
              otherMatIn.inputType = IVar9;
              otherMatIn.dataType = DVar3;
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar1 = local_110->m_testCtx;
              glu::getDataTypeName(DVar3);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_180);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar11 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_1a0.field_2._M_allocated_capacity = *psVar11;
                local_1a0.field_2._8_8_ = plVar5[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar11;
                local_1a0._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_1a0._M_string_length = plVar5[1];
              *plVar5 = (long)psVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              scalarIn._0_8_ = &local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Matrix-matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar1,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,OP_MUL,
                         true);
              tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_128) {
                operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar1 = local_110->m_testCtx;
              glu::getDataTypeName(DVar3);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_180);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar11 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_1a0.field_2._M_allocated_capacity = *psVar11;
                local_1a0.field_2._8_8_ = plVar5[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar11;
                local_1a0._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_1a0._M_string_length = plVar5[1];
              *plVar5 = (long)psVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              scalarIn._0_8_ = &local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Matrix-matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar1,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,OP_MUL,
                         false);
              tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_128) {
                operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 != 5);
          }
          else if (op < OP_OUTER_PRODUCT) {
            otherMatIn.dataType = local_a4;
            otherMatIn.precision = local_114;
            otherMatIn.inputType = IVar9;
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,(allocator<char> *)&colVecIn
                      );
            scalarIn._0_8_ = &local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalarIn,"Matrix-matrix case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,op,true);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar11;
              local_1a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,(allocator<char> *)&colVecIn
                      );
            scalarIn._0_8_ = &local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalarIn,"Matrix-matrix case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,op,false);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)scalarIn._0_8_ != &local_128) {
              operator_delete((void *)scalarIn._0_8_,local_128._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((op - OP_UNARY_PLUS < 6) || (op == OP_TRANSPOSE)) {
LAB_005966cd:
            scalarIn.inputType = INPUTTYPE_LAST;
            scalarIn.dataType = TYPE_LAST;
            stack0xfffffffffffffed0 = CONCAT44(uStack_12c,3);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"Matrix case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,&local_180,&matIn,&scalarIn,op,true);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"Matrix case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,&local_180,&matIn,&scalarIn,op,false);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            if (op == OP_OUTER_PRODUCT) {
              scalarIn.dataType = glu::getDataTypeFloatVec(vecSize);
              scalarIn.inputType = local_a8;
              stack0xfffffffffffffed0 = CONCAT44(uStack_12c,local_114);
              otherMatIn.dataType = glu::getDataTypeFloatVec(local_a0);
              otherMatIn.precision = local_114;
              otherMatIn.inputType = IVar9;
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar1 = local_110->m_testCtx;
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a0,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_1a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_180,"Vector-vector case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar1,&vecMatName,&local_180,&scalarIn,&otherMatIn,OP_OUTER_PRODUCT
                         ,true);
              tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar1 = local_110->m_testCtx;
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a0,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_1a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_180,"Vector-vector case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar1,&vecMatName,&local_180,&scalarIn,&otherMatIn,OP_OUTER_PRODUCT
                         ,false);
              tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if (op - OP_UNARY_PLUS < 6) goto LAB_005966cd;
            }
            if (local_f9 != '\0') goto LAB_005966cd;
          }
          if (((op < OP_LAST) && ((0x58000U >> (op & (OP_SUBTRACT_FROM|OP_ADD_INTO)) & 1) != 0)) ||
             (local_115 != 0)) {
            scalarIn.dataType = local_a4;
            scalarIn.inputType = IVar9;
            stack0xfffffffffffffed0 = CONCAT44(uStack_12c,local_114);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Matrix assignment case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,&local_180,&matIn,&scalarIn,op,true);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar1 = local_110->m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Matrix assignment case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar1,&vecMatName,&local_180,&matIn,&scalarIn,op,false);
            tcu::TestNode::addChild(local_108,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          bVar14 = lVar10 == 0;
          lVar10 = lVar10 + 1;
        } while (bVar14);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 9);
    } while ((uVar7 < 2) && (uVar7 = uVar7 + 1, local_fb != '\0'));
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x13) {
      return 0x13;
    }
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		const MatrixOp	op;
		const bool		extendedInputTypeCases; // !< test with const and uniform types too
		const bool		createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		const InputType	type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}